

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_polygon.c
# Opt level: O2

int hit_vertex(int mx,int my)

{
  long lVar1;
  int iVar2;
  int iVar3;
  
  lVar1 = 0;
  while( true ) {
    if (ex.vertex_count <= lVar1) {
      return -1;
    }
    iVar2 = (int)(ex.vertices[lVar1].x - (float)mx);
    iVar3 = (int)(ex.vertices[lVar1].y - (float)my);
    if ((uint)(iVar3 * iVar3 + iVar2 * iVar2) < 0x1a) break;
    lVar1 = lVar1 + 1;
  }
  return (int)lVar1;
}

Assistant:

static int hit_vertex(int mx, int my)
{
   int i;

   for (i = 0; i < ex.vertex_count; i++) {
      int dx = ex.vertices[i].x - mx;
      int dy = ex.vertices[i].y - my;
      int dd = dx*dx + dy*dy;
      if (dd <= RADIUS * RADIUS)
         return i;
   }

   return -1;
}